

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O2

int32_t submit_headers_shared_nva
                  (nghttp2_session *session,uint8_t flags,int32_t stream_id,
                  nghttp2_priority_spec *pri_spec,nghttp2_nv *nva,size_t nvlen,
                  nghttp2_data_provider *data_prd,void *stream_user_data)

{
  nghttp2_mem *mem;
  nghttp2_data_source_read_callback p_Var1;
  int iVar2;
  nghttp2_outbound_item *item;
  nghttp2_headers_category cat;
  uint32_t uVar3;
  nghttp2_priority_spec copy_pri_spec;
  nghttp2_nv *nva_copy;
  
  mem = &session->mem;
  if (pri_spec == (nghttp2_priority_spec *)0x0) {
    nghttp2_priority_spec_default_init(&copy_pri_spec);
  }
  else {
    copy_pri_spec.exclusive = pri_spec->exclusive;
    copy_pri_spec._9_3_ = *(undefined3 *)&pri_spec->field_0x9;
    copy_pri_spec.stream_id = pri_spec->stream_id;
    copy_pri_spec.weight = pri_spec->weight;
    nghttp2_priority_spec_normalize_weight(&copy_pri_spec);
  }
  iVar2 = nghttp2_nv_array_copy(&nva_copy,nva,nvlen,mem);
  if (iVar2 < 0) {
    return iVar2;
  }
  item = (nghttp2_outbound_item *)nghttp2_mem_malloc(mem,0x98);
  if (item == (nghttp2_outbound_item *)0x0) {
    iVar2 = -0x385;
LAB_0052678d:
    nghttp2_nv_array_del(nva_copy,mem);
  }
  else {
    nghttp2_outbound_item_init(item);
    if ((data_prd != (nghttp2_data_provider *)0x0) &&
       (data_prd->read_callback != (nghttp2_data_source_read_callback)0x0)) {
      p_Var1 = data_prd->read_callback;
      (item->aux_data).data.data_prd.source = data_prd->source;
      (item->aux_data).data.data_prd.read_callback = p_Var1;
    }
    (item->aux_data).headers.stream_user_data = stream_user_data;
    if (stream_id == -1) {
      stream_id = session->next_stream_id;
      if (stream_id < 0) {
        iVar2 = -0x1fd;
        goto LAB_0052678d;
      }
      session->next_stream_id = stream_id + 2;
      cat = NGHTTP2_HCAT_REQUEST;
      uVar3 = stream_id;
    }
    else {
      cat = NGHTTP2_HCAT_HEADERS;
      uVar3 = 0;
    }
    nghttp2_frame_headers_init
              ((nghttp2_headers *)item,flags & 0x21 | 4,stream_id,cat,&copy_pri_spec,nva_copy,nvlen)
    ;
    iVar2 = nghttp2_session_add_item(session,item);
    if (iVar2 == 0) {
      return uVar3;
    }
    nghttp2_frame_headers_free((nghttp2_headers *)item,mem);
  }
  nghttp2_mem_free(mem,item);
  return iVar2;
}

Assistant:

static int32_t submit_headers_shared_nva(nghttp2_session *session,
                                         uint8_t flags, int32_t stream_id,
                                         const nghttp2_priority_spec *pri_spec,
                                         const nghttp2_nv *nva, size_t nvlen,
                                         const nghttp2_data_provider *data_prd,
                                         void *stream_user_data) {
  int rv;
  nghttp2_nv *nva_copy;
  nghttp2_priority_spec copy_pri_spec;
  nghttp2_mem *mem;

  mem = &session->mem;

  if (pri_spec) {
    copy_pri_spec = *pri_spec;
    nghttp2_priority_spec_normalize_weight(&copy_pri_spec);
  } else {
    nghttp2_priority_spec_default_init(&copy_pri_spec);
  }

  rv = nghttp2_nv_array_copy(&nva_copy, nva, nvlen, mem);
  if (rv < 0) {
    return rv;
  }

  return submit_headers_shared(session, flags, stream_id, &copy_pri_spec,
                               nva_copy, nvlen, data_prd, stream_user_data);
}